

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_relative_location_path
          (xpath_parser *this,xpath_ast_node *set)

{
  size_t sVar1;
  lexeme_t lVar2;
  ulong uVar3;
  xpath_ast_node *pxVar4;
  bool bVar5;
  lexeme_t l;
  size_t old_depth;
  xpath_ast_node *n;
  xpath_ast_node *set_local;
  xpath_parser *this_local;
  
  old_depth = (size_t)parse_step(this,set);
  if ((xpath_ast_node *)old_depth != (xpath_ast_node *)0x0) {
    sVar1 = this->_depth;
    do {
      lVar2 = xpath_lexer::current(&this->_lexer);
      bVar5 = true;
      if (lVar2 != lex_slash) {
        lVar2 = xpath_lexer::current(&this->_lexer);
        bVar5 = lVar2 == lex_double_slash;
      }
      if (!bVar5) {
        this->_depth = sVar1;
        return (xpath_ast_node *)old_depth;
      }
      lVar2 = xpath_lexer::current(&this->_lexer);
      xpath_lexer::next(&this->_lexer);
      if (lVar2 == lex_double_slash) {
        old_depth = (size_t)alloc_node(this,ast_step,(xpath_ast_node *)old_depth,
                                       axis_descendant_or_self,nodetest_type_node,(char_t *)0x0);
        if ((xpath_ast_node *)old_depth == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        this->_depth = this->_depth + 1;
      }
      uVar3 = this->_depth + 1;
      this->_depth = uVar3;
      if (0x400 < uVar3) {
        pxVar4 = error_rec(this);
        return pxVar4;
      }
      old_depth = (size_t)parse_step(this,(xpath_ast_node *)old_depth);
    } while ((xpath_ast_node *)old_depth != (xpath_ast_node *)0x0);
  }
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_relative_location_path(xpath_ast_node* set)
		{
			xpath_ast_node* n = parse_step(set);
			if (!n) return 0;

			size_t old_depth = _depth;

			while (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
			{
				lexeme_t l = _lexer.current();
				_lexer.next();

				if (l == lex_double_slash)
				{
					n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
					if (!n) return 0;

					++_depth;
				}

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				n = parse_step(n);
				if (!n) return 0;
			}

			_depth = old_depth;

			return n;
		}